

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<4UL>
mserialize::cx_strcat<1ul,1ul,1ul,1ul>
          (cx_string<1UL> *strings,cx_string<1UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  char buffer [5];
  undefined8 local_70;
  ulong auStack_68 [7];
  cx_string<1UL> *local_30 [5];
  
  pcVar1 = buffer;
  buffer[4] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  local_30[0] = strings;
  local_30[1] = strings_1;
  local_30[2] = strings_2;
  local_30[3] = strings_3;
  auStack_68[1] = 1;
  auStack_68[2] = 1;
  auStack_68[3] = 1;
  auStack_68[4] = 1;
  for (lVar2 = 1; lVar2 != 5; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_68[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = local_30[lVar2 + -1]->_data[uVar3];
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<4UL>::cx_string((cx_string<4UL> *)&local_70,buffer);
  return (char  [5])((uint5)local_70._4_4_ << 0x20 | (uint5)(uint)local_70);
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}